

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

enable_if_t<_std::is_same<std::decay_t<const_char_(&)[14]>,_variant<int,_basic_string<char>_>_>::value>
 __thiscall
Catch::Generators::Generators<std::variant<int,std::__cxx11::string>>::
add_generator<char_const(&)[14]>
          (Generators<std::variant<int,std::__cxx11::string>> *this,char (*val) [14])

{
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char (*local_18) [14];
  char (*val_local) [14];
  Generators<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  local_18 = val;
  val_local = (char (*) [14])this;
  std::variant<int,std::__cxx11::string>::
  variant<char_const(&)[14],void,void,std::__cxx11::string,void>
            ((variant<int,std::__cxx11::string> *)&local_40,val);
  Generators<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::add_generator((Generators<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,&local_40);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant(&local_40);
  return;
}

Assistant:

std::enable_if_t<!std::is_same<std::decay_t<U>, T>::value>
        add_generator( U&& val ) {
            add_generator( T( CATCH_FORWARD( val ) ) );
        }